

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blockcache.cc
# Opt level: O0

fdb_status bcache_flush(filemgr *file)

{
  __pointer_type fname_item_00;
  fdb_status status;
  fnamedic_item *fname_item;
  undefined4 local_14;
  
  local_14 = FDB_RESULT_SUCCESS;
  fname_item_00 = std::atomic::operator_cast_to_fnamedic_item_((atomic<fnamedic_item_*> *)0x108492);
  if (fname_item_00 != (__pointer_type)0x0) {
    local_14 = _flush_dirty_blocks(fname_item_00,true,true,false);
  }
  return local_14;
}

Assistant:

fdb_status bcache_flush(struct filemgr *file)
{
    struct fnamedic_item *fname_item;
    fdb_status status = FDB_RESULT_SUCCESS;

    fname_item = file->bcache;

    if (fname_item) {
        // Note that this function is invoked as part of a commit operation while
        // the filemgr's lock is already grabbed by a committer.
        // Therefore, we don't need to grab all the shard locks at once.
        status = _flush_dirty_blocks(fname_item, true, true, false);
    }
    return status;
}